

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

Split * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::find
          (Split *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,SetMB *set,
          size_t logBlockSize,LinearSpace3fa *space)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  char cVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  runtime_error *this_00;
  undefined8 *puVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [16];
  PrimRefMB *ref;
  ulong uVar15;
  float fVar16;
  uint uVar17;
  uint uVar19;
  uint uVar20;
  undefined1 auVar18 [16];
  uint uVar21;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar22 [16];
  uint uVar26;
  uint uVar27;
  undefined1 auVar28 [16];
  __m128 afVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  undefined1 auVar34 [16];
  float fVar35;
  __m128 afVar36;
  __m128 afVar37;
  float fVar38;
  uint uVar39;
  float fVar40;
  uint uVar41;
  uint uVar42;
  __m128 afVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar51;
  float fVar52;
  __m128 afVar50;
  BinMapping<32UL> mapping;
  Vec3fa center1;
  Vec3fa center0;
  BinBoundsAndCenter binBoundsAndCenter;
  LBBox<embree::Vec3fa> prim1;
  ObjectBinner binner;
  LBBox<embree::Vec3fa> prim0;
  __m128 local_37f0;
  undefined1 local_37e0 [16];
  __m128 local_37d0;
  __m128 local_37c0;
  undefined1 local_37b0 [16];
  undefined1 local_37a0 [16];
  __m128 local_3790;
  undefined1 local_3780 [16];
  undefined1 local_3770 [20];
  float fStack_375c;
  float fStack_3758;
  float fStack_3754;
  float local_3750 [3];
  uint uStack_3744;
  ulong local_3740;
  PrimRefMB *local_3728;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3720;
  BinBoundsAndCenter *local_3710;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3700;
  undefined8 local_36f0;
  BinBoundsAndCenter local_36e0;
  anon_class_8_1_b5464bae local_3698;
  anon_class_16_2_ed117de8_conflict18 local_3690;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3680;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_3670;
  undefined1 local_3660 [16];
  undefined1 local_3650 [16];
  float afStack_3530 [4];
  undefined1 auStack_3520 [16];
  float afStack_3510 [4];
  undefined1 auStack_3500 [16];
  float afStack_34f0 [4];
  undefined1 auStack_34e0 [16];
  float afStack_34d0 [4];
  undefined1 auStack_34c0 [16];
  float afStack_34b0 [4];
  undefined1 auStack_34a0 [16];
  float afStack_3490 [4];
  undefined1 local_3480 [6652];
  undefined4 uStack_1a84;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a80;
  undefined1 local_1a70 [8];
  float afStack_1a68 [2];
  undefined1 local_1a60 [16];
  undefined1 local_1a50 [16];
  
  local_36e0.scene = this->scene;
  local_36e0.time_range = (set->super_PrimInfoMB).time_range;
  local_36e0.space.vx.field_0._0_8_ = *(undefined8 *)&(space->vx).field_0;
  local_36e0.space.vx.field_0._8_8_ = *(undefined8 *)((long)&(space->vx).field_0 + 8);
  local_36e0.space.vy.field_0._0_8_ = *(undefined8 *)&(space->vy).field_0;
  local_36e0.space.vy.field_0._8_8_ = *(undefined8 *)((long)&(space->vy).field_0 + 8);
  local_36e0.space.vz.field_0._0_8_ = *(undefined8 *)&(space->vz).field_0;
  local_36e0.space.vz.field_0._8_8_ = *(undefined8 *)((long)&(space->vz).field_0 + 8);
  puVar10 = (undefined8 *)(local_3480 + 0x1800);
  for (lVar8 = 0xb0; lVar8 != 0x18b0; lVar8 = lVar8 + 0xc0) {
    *(__m128 *)((long)afStack_34b0 + lVar8) = _DAT_01f45a30;
    *(undefined1 (*) [16])(auStack_34a0 + lVar8) = _DAT_01f45a40;
    *(__m128 *)((long)afStack_3490 + lVar8) = _DAT_01f45a30;
    *(undefined1 (*) [16])(local_3480 + lVar8) = _DAT_01f45a40;
    *(__m128 *)((long)afStack_34f0 + lVar8) = _DAT_01f45a30;
    *(undefined1 (*) [16])(auStack_34e0 + lVar8) = _DAT_01f45a40;
    *(__m128 *)((long)afStack_34d0 + lVar8) = _DAT_01f45a30;
    *(undefined1 (*) [16])(auStack_34c0 + lVar8) = _DAT_01f45a40;
    *(__m128 *)((long)afStack_3530 + lVar8) = _DAT_01f45a30;
    *(undefined1 (*) [16])(auStack_3520 + lVar8) = _DAT_01f45a40;
    *(__m128 *)((long)afStack_3510 + lVar8) = _DAT_01f45a30;
    *(undefined1 (*) [16])(auStack_3500 + lVar8) = _DAT_01f45a40;
    *puVar10 = 0;
    puVar10[1] = 0;
    puVar10 = puVar10 + 2;
  }
  uVar1 = (set->super_PrimInfoMB).object_range._begin;
  uVar2 = (set->super_PrimInfoMB).object_range._end;
  local_3740 = uVar2 - uVar1;
  fVar16 = (float)local_3740 * 0.05 + 4.0;
  uVar9 = (ulong)fVar16;
  uVar9 = (long)(fVar16 - 9.223372e+18) & (long)uVar9 >> 0x3f | uVar9;
  local_3770._0_8_ = 0x20;
  if (uVar9 < 0x20) {
    local_3770._0_8_ = uVar9;
  }
  local_3770._16_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.lower.
       field_0.m128[0];
  fStack_375c = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                lower.field_0.m128[1];
  fStack_3758 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                lower.field_0.m128[2];
  fStack_3754 = (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.
                lower.field_0.m128[3];
  auVar22._0_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[0] - (float)local_3770._16_4_;
  auVar22._4_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[1] - fStack_375c;
  auVar22._8_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[2] - fStack_3758;
  auVar22._12_4_ =
       (set->super_PrimInfoMB).super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds.upper.
       field_0.m128[3] - fStack_3754;
  auVar28 = maxps(_DAT_01f46b30,auVar22);
  auVar34._0_4_ = (float)(long)local_3770._0_8_ * 0.99;
  auVar34._4_4_ = auVar34._0_4_;
  auVar34._8_4_ = auVar34._0_4_;
  auVar34._12_4_ = auVar34._0_4_;
  auVar22 = divps(auVar34,auVar28);
  uStack_3744 = -(uint)(DAT_01f46b30._12_4_ < auVar28._12_4_) & auVar22._12_4_;
  local_3750[0] = (float)(-(uint)((float)DAT_01f46b30 < auVar28._0_4_) & auVar22._0_4_);
  local_3750[1] = (float)(-(uint)(DAT_01f46b30._4_4_ < auVar28._4_4_) & auVar22._4_4_);
  local_3750[2] = (float)(-(uint)(DAT_01f46b30._8_4_ < auVar28._8_4_) & auVar22._8_4_);
  local_3728 = set->prims->items;
  local_37a0 = _DAT_01f45a40;
  if (local_3740 < 0xc00) {
    if (uVar2 != uVar1) {
      uVar9 = local_3740 - 1;
      ref = local_3728 + uVar1 + 1;
      for (uVar15 = 0; uVar15 < uVar9; uVar15 = uVar15 + 2) {
        BinBoundsAndCenter::binBoundsAndCenter
                  (&local_36e0,ref + -1,(LBBox3fa *)&local_1a80.field_1,
                   (Vec3fa *)&local_3700.field_1);
        fVar44 = local_3750[2];
        fVar40 = local_3750[1];
        fVar38 = local_3750[0];
        fVar35 = fStack_3758;
        fVar16 = fStack_375c;
        uVar4 = local_3770._16_4_;
        uVar17 = (uint)((local_3700.m128[0] - (float)local_3770._16_4_) * local_3750[0] + -0.5);
        uVar19 = (uint)((local_3700.m128[1] - fStack_375c) * local_3750[1] + -0.5);
        uVar20 = (uint)((local_3700.m128[2] - fStack_3758) * local_3750[2] + -0.5);
        uVar7 = local_3770._0_4_ - 1;
        uVar21 = -(uint)((int)uVar7 < (int)uVar17);
        uVar23 = -(uint)((int)uVar7 < (int)uVar19);
        uVar24 = -(uint)((int)uVar7 < (int)uVar20);
        uVar21 = ~uVar21 & uVar17 | uVar7 & uVar21;
        uVar27 = ~uVar23 & uVar19 | uVar7 & uVar23;
        uVar26 = ~uVar24 & uVar20 | uVar7 & uVar24;
        BinBoundsAndCenter::binBoundsAndCenter
                  (&local_36e0,ref,(LBBox3fa *)&local_3680.field_1,(Vec3fa *)&local_3720.field_1);
        uVar17 = (uint)((local_3720.m128[0] - (float)uVar4) * fVar38 + -0.5);
        uVar19 = (uint)((local_3720.m128[1] - fVar16) * fVar40 + -0.5);
        uVar20 = (uint)((local_3720.m128[2] - fVar35) * fVar44 + -0.5);
        uVar23 = -(uint)((int)uVar7 < (int)uVar17);
        uVar24 = -(uint)((int)uVar7 < (int)uVar19);
        uVar25 = -(uint)((int)uVar7 < (int)uVar20);
        uVar17 = ~uVar23 & uVar17 | uVar7 & uVar23;
        uVar19 = ~uVar24 & uVar19 | uVar7 & uVar24;
        uVar7 = ~uVar25 & uVar20 | uVar7 & uVar25;
        iVar30 = *(int *)((long)&ref[-1].lbounds.bounds1.lower.field_0 + 0xc);
        uVar3 = (ulong)(-(uint)(0 < (int)uVar27) & uVar27);
        uVar11 = (ulong)(-(uint)(0 < (int)uVar21) & uVar21);
        lVar8 = uVar11 * 0xc0;
        *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) =
             *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) + iVar30;
        auVar28 = local_1a50;
        auVar34 = local_1a60;
        auVar22 = _local_1a70;
        aVar5 = local_1a80;
        auVar18 = minps(*(undefined1 (*) [16])(local_3480 + lVar8),(undefined1  [16])local_1a80);
        *(undefined1 (*) [16])(local_3480 + lVar8) = auVar18;
        auVar18 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x10),_local_1a70);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x10) = auVar18;
        auVar18 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x20),local_1a60);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x20) = auVar18;
        auVar18 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x30),local_1a50);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x30) = auVar18;
        lVar8 = uVar3 * 0xc0;
        *(int *)(local_3480 + uVar3 * 0x10 + 0x1804) =
             *(int *)(local_3480 + uVar3 * 0x10 + 0x1804) + iVar30;
        auVar18 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x40),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x40) = auVar18;
        auVar18 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x50),auVar22);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x50) = auVar18;
        auVar18 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x60),auVar34);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x60) = auVar18;
        auVar18 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x70),auVar28);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x70) = auVar18;
        uVar11 = (ulong)(-(uint)(0 < (int)uVar26) & uVar26);
        lVar8 = uVar11 * 0xc0;
        *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) =
             *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) + iVar30;
        auVar18 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x80),(undefined1  [16])aVar5);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x80) = auVar18;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x90),auVar22);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x90) = auVar22;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0),auVar34);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0),auVar28);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0) = auVar22;
        iVar30 = *(int *)((long)&(ref->lbounds).bounds1.lower.field_0 + 0xc);
        uVar11 = (ulong)(-(uint)(0 < (int)uVar17) & uVar17);
        lVar8 = uVar11 * 0xc0;
        *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) =
             *(int *)(local_3480 + uVar11 * 0x10 + 0x1800) + iVar30;
        auVar28._4_4_ = local_3680.m128[1];
        auVar28._0_4_ = local_3680.m128[0];
        auVar28._8_4_ = local_3680.m128[2];
        auVar28._12_4_ = local_3680.m128[3];
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8),auVar28);
        *(undefined1 (*) [16])(local_3480 + lVar8) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x10),
                        (undefined1  [16])local_3670);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x10) = auVar22;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x20),local_3660);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x20) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x30),local_3650);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x30) = auVar22;
        uVar11 = (ulong)(-(uint)(0 < (int)uVar19) & uVar19);
        lVar8 = uVar11 * 0xc0;
        *(int *)(local_3480 + uVar11 * 0x10 + 0x1804) =
             *(int *)(local_3480 + uVar11 * 0x10 + 0x1804) + iVar30;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x40),auVar28);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x40) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x50),
                        (undefined1  [16])local_3670);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x50) = auVar22;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x60),local_3660);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x60) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x70),local_3650);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x70) = auVar22;
        uVar11 = (ulong)(-(uint)(0 < (int)uVar7) & uVar7);
        lVar8 = uVar11 * 0xc0;
        *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) =
             *(int *)(local_3480 + uVar11 * 0x10 + 0x1808) + iVar30;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x80),auVar28);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x80) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x90),
                        (undefined1  [16])local_3670);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x90) = auVar22;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0),local_3660);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0),local_3650);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0) = auVar22;
        ref = ref + 2;
      }
      if (uVar15 < local_3740) {
        BinBoundsAndCenter::binBoundsAndCenter
                  (&local_36e0,ref + -1,(LBBox3fa *)&local_1a80.field_1,
                   (Vec3fa *)&local_3680.field_1);
        uVar17 = (uint)((local_3680.m128[0] - (float)local_3770._16_4_) * local_3750[0] + -0.5);
        uVar19 = (uint)((local_3680.m128[1] - fStack_375c) * local_3750[1] + -0.5);
        uVar20 = (uint)((local_3680.m128[2] - fStack_3758) * local_3750[2] + -0.5);
        uVar7 = local_3770._0_4_ - 1;
        uVar21 = -(uint)((int)uVar7 < (int)uVar17);
        uVar23 = -(uint)((int)uVar7 < (int)uVar19);
        uVar27 = -(uint)((int)uVar7 < (int)uVar20);
        uVar17 = ~uVar21 & uVar17 | uVar7 & uVar21;
        uVar19 = ~uVar23 & uVar19 | uVar7 & uVar23;
        uVar7 = ~uVar27 & uVar20 | uVar7 & uVar27;
        iVar30 = *(int *)((long)&ref[-1].lbounds.bounds1.lower.field_0 + 0xc);
        uVar9 = (ulong)(-(uint)(0 < (int)uVar17) & uVar17);
        lVar8 = uVar9 * 0xc0;
        *(int *)(local_3480 + uVar9 * 0x10 + 0x1800) =
             *(int *)(local_3480 + uVar9 * 0x10 + 0x1800) + iVar30;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8),(undefined1  [16])local_1a80);
        *(undefined1 (*) [16])(local_3480 + lVar8) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x10),_local_1a70);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x10) = auVar22;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x20),local_1a60);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x20) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x30),local_1a50);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x30) = auVar22;
        uVar9 = (ulong)(-(uint)(0 < (int)uVar19) & uVar19);
        lVar8 = uVar9 * 0xc0;
        *(int *)(local_3480 + uVar9 * 0x10 + 0x1804) =
             *(int *)(local_3480 + uVar9 * 0x10 + 0x1804) + iVar30;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x40),
                        (undefined1  [16])local_1a80);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x40) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x50),_local_1a70);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x50) = auVar22;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x60),local_1a60);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x60) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x70),local_1a50);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x70) = auVar22;
        uVar9 = (ulong)(-(uint)(0 < (int)uVar7) & uVar7);
        lVar8 = uVar9 * 0xc0;
        *(int *)(local_3480 + uVar9 * 0x10 + 0x1808) =
             *(int *)(local_3480 + uVar9 * 0x10 + 0x1808) + iVar30;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x80),
                        (undefined1  [16])local_1a80);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x80) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0x90),_local_1a70);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0x90) = auVar22;
        auVar22 = minps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0),local_1a60);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xa0) = auVar22;
        auVar22 = maxps(*(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0),local_1a50);
        *(undefined1 (*) [16])(local_3480 + lVar8 + 0xb0) = auVar22;
      }
    }
  }
  else {
    local_3720._0_8_ = &local_3728;
    local_3720._8_8_ = local_3770;
    local_3710 = &local_36e0;
    local_3698.mapping = (BinMapping<32UL> *)local_3720._8_8_;
    tbb::detail::d1::task_group_context::task_group_context
              ((task_group_context *)&local_3680.field_1,(context_traits)0x4,CUSTOM_CTX);
    local_3700._8_8_ = uVar1;
    local_3700._0_8_ = uVar2;
    local_36f0 = 0x400;
    local_3690.reduction = &local_3698;
    local_3690.func = (anon_class_24_3_4f408fa6_conflict *)&local_3720;
    tbb::detail::d1::
    parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,_embree::sse2::BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_______common_algorithms_parallel_reduce_h:59:7),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders____builders_heuristic_binning_h:525:31)>
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
               &local_1a80.field_1,(blocked_range<unsigned_long> *)&local_3700.field_1,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               &local_3690,&local_3698,(task_group_context *)&local_3680.field_1);
    cVar6 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&local_3680.field_1)
    ;
    if (cVar6 != '\0') {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"task cancelled");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context
              ((task_group_context *)&local_3680.field_1);
    BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_>::operator=
              ((BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)local_3480,
               (BinInfoT<32UL,_embree::PrimRefMB,_embree::LBBox<embree::Vec3fa>_> *)
               &local_1a80.field_1);
  }
  lVar12 = local_3770._0_8_ * 0xc0 + -0x10;
  lVar8 = local_3770._0_8_ * 0x10 + 0x17f0;
  iVar30 = 0;
  iVar31 = 0;
  iVar32 = 0;
  iVar33 = 0;
  auVar22 = _DAT_01f45a40;
  afVar29 = _DAT_01f45a30;
  auVar34 = _DAT_01f45a40;
  afVar36 = _DAT_01f45a30;
  auVar28 = _DAT_01f45a40;
  afVar37 = _DAT_01f45a30;
  afVar43 = _DAT_01f45a30;
  auVar18 = _DAT_01f45a40;
  afVar50 = _DAT_01f45a30;
  lVar13 = local_3770._0_8_ * 0x10;
  local_37d0 = (__m128)_DAT_01f45a40;
  local_37c0 = _DAT_01f45a30;
  for (uVar9 = 1; local_3770._0_8_ != uVar9; uVar9 = uVar9 + 1) {
    afVar37 = (__m128)minps((undefined1  [16])afVar37,
                            *(undefined1 (*) [16])((long)afStack_3530 + lVar12));
    auVar22 = maxps(auVar22,*(undefined1 (*) [16])(auStack_3520 + lVar12));
    afVar43 = (__m128)minps((undefined1  [16])afVar43,
                            *(undefined1 (*) [16])((long)afStack_3510 + lVar12));
    auVar18 = maxps(auVar18,*(undefined1 (*) [16])(auStack_3500 + lVar12));
    fVar38 = auVar22._4_4_ - afVar37[1];
    fVar40 = auVar22._8_4_ - afVar37[2];
    fVar44 = auVar18._4_4_ - afVar43[1];
    fVar46 = auVar18._8_4_ - afVar43[2];
    local_37c0 = (__m128)minps((undefined1  [16])local_37c0,
                               *(undefined1 (*) [16])((long)afStack_34f0 + lVar12));
    local_37d0 = (__m128)maxps((undefined1  [16])local_37d0,
                               *(undefined1 (*) [16])(auStack_34e0 + lVar12));
    afVar36 = (__m128)minps((undefined1  [16])afVar36,
                            *(undefined1 (*) [16])((long)afStack_34d0 + lVar12));
    auVar28 = maxps(auVar28,*(undefined1 (*) [16])(auStack_34c0 + lVar12));
    fVar16 = local_37d0[1] - local_37c0[1];
    fVar35 = local_37d0[2] - local_37c0[2];
    fVar51 = auVar28._4_4_ - afVar36[1];
    fVar52 = auVar28._8_4_ - afVar36[2];
    afVar50 = (__m128)minps((undefined1  [16])afVar50,
                            *(undefined1 (*) [16])((long)afStack_34b0 + lVar12));
    local_37a0 = maxps(local_37a0,*(undefined1 (*) [16])(auStack_34a0 + lVar12));
    afVar29 = (__m128)minps((undefined1  [16])afVar29,
                            *(undefined1 (*) [16])((long)afStack_3490 + lVar12));
    auVar34 = maxps(auVar34,*(undefined1 (*) [16])(local_3480 + lVar12));
    *(ulong *)(local_3480 + lVar13 + 0x19f0) =
         CONCAT44(((auVar28._0_4_ - afVar36[0]) * (fVar51 + fVar52) + fVar52 * fVar51 +
                  (local_37d0[0] - local_37c0[0]) * (fVar16 + fVar35) + fVar35 * fVar16) * 0.5,
                  ((auVar18._0_4_ - afVar43[0]) * (fVar44 + fVar46) + fVar46 * fVar44 +
                  (auVar22._0_4_ - afVar37[0]) * (fVar38 + fVar40) + fVar40 * fVar38) * 0.5);
    fVar16 = local_37a0._4_4_ - afVar50[1];
    fVar38 = local_37a0._8_4_ - afVar50[2];
    fVar35 = auVar34._4_4_ - afVar29[1];
    fVar40 = auVar34._8_4_ - afVar29[2];
    *(float *)(local_3480 + lVar13 + 0x19f8) =
         ((fVar35 + fVar40) * (auVar34._0_4_ - afVar29[0]) + fVar40 * fVar35 +
         (fVar16 + fVar38) * (local_37a0._0_4_ - afVar50[0]) + fVar38 * fVar16) * 0.5;
    iVar30 = iVar30 + *(int *)(local_3480 + lVar8);
    iVar31 = iVar31 + *(int *)(local_3480 + lVar8 + 4);
    iVar32 = iVar32 + *(int *)(local_3480 + lVar8 + 8);
    iVar33 = iVar33 + *(int *)(local_3480 + lVar8 + 0xc);
    *(int *)((long)&local_3690.reduction + lVar13) = iVar30;
    *(int *)((long)&local_3690.reduction + lVar13 + 4) = iVar31;
    *(int *)((long)&local_3690.func + lVar13) = iVar32;
    *(int *)((long)&local_3690.func + lVar13 + 4) = iVar33;
    *(undefined4 *)((long)&uStack_1a84 + lVar13) = 0;
    lVar12 = lVar12 + -0xc0;
    lVar8 = lVar8 + -0x10;
    lVar13 = lVar13 + -0x10;
  }
  uVar9 = 0xffffffffffffffff;
  uVar21 = ~(-1 << ((byte)logBlockSize & 0x1f));
  uVar7 = 1;
  uVar17 = 1;
  uVar19 = 1;
  uVar20 = 1;
  local_3720.m128[0] = (float)0;
  local_3720.m128[1] = (float)0;
  local_3720.m128[2] = (float)0;
  local_3720.m128[3] = (float)0;
  pauVar14 = (undefined1 (*) [16])(local_3480 + 0xb0);
  lVar8 = 0;
  local_37c0[0] = _DAT_01f45a30;
  local_37c0[1] = _UNK_01f45a34;
  local_37c0[2] = _UNK_01f45a38;
  local_37c0[3] = _UNK_01f45a3c;
  local_37d0[0] = _DAT_01f45a30;
  local_37d0[1] = _UNK_01f45a34;
  local_37d0[2] = _UNK_01f45a38;
  local_37d0[3] = _UNK_01f45a3c;
  local_3780 = _DAT_01f45a40;
  local_3790[0] = _DAT_01f45a30;
  local_3790[1] = _UNK_01f45a34;
  local_3790[2] = _UNK_01f45a38;
  local_3790[3] = _UNK_01f45a3c;
  local_37e0 = _DAT_01f45a40;
  local_37f0[0] = _DAT_01f45a30;
  local_37f0[1] = _UNK_01f45a34;
  local_37f0[2] = _UNK_01f45a38;
  local_37f0[3] = _UNK_01f45a3c;
  local_37b0 = _DAT_01f45a40;
  local_37a0 = _DAT_01f45a40;
  iVar30 = 0;
  iVar31 = 0;
  iVar32 = 0;
  iVar33 = 0;
  auVar22 = _DAT_01f45a40;
  afVar29 = _DAT_01f45a30;
  afVar36 = _DAT_01f45a30;
  auVar34 = _DAT_01f45a40;
  afVar37 = _DAT_01f45a30;
  for (uVar15 = 1; uVar15 < (ulong)local_3770._0_8_; uVar15 = uVar15 + 1) {
    afVar29 = (__m128)minps((undefined1  [16])afVar29,pauVar14[-0xb]);
    auVar22 = maxps(auVar22,pauVar14[-10]);
    afVar36 = (__m128)minps((undefined1  [16])afVar36,pauVar14[-9]);
    auVar34 = maxps(auVar34,pauVar14[-8]);
    fVar16 = auVar22._4_4_ - afVar29[1];
    fVar35 = auVar22._8_4_ - afVar29[2];
    fVar44 = auVar34._4_4_ - afVar36[1];
    fVar46 = auVar34._8_4_ - afVar36[2];
    local_3790 = (__m128)minps((undefined1  [16])local_3790,pauVar14[-7]);
    local_37e0 = maxps(local_37e0,pauVar14[-6]);
    local_37f0 = (__m128)minps((undefined1  [16])local_37f0,pauVar14[-5]);
    local_37b0 = maxps(local_37b0,pauVar14[-4]);
    fVar45 = local_37e0._4_4_ - local_3790[1];
    fVar47 = local_37e0._8_4_ - local_3790[2];
    fVar51 = local_37b0._4_4_ - local_37f0[1];
    fVar52 = local_37b0._8_4_ - local_37f0[2];
    local_37c0 = (__m128)minps((undefined1  [16])local_37c0,pauVar14[-3]);
    local_37a0 = maxps(local_37a0,pauVar14[-2]);
    local_37d0 = (__m128)minps((undefined1  [16])local_37d0,pauVar14[-1]);
    local_3780 = maxps(local_3780,*pauVar14);
    fVar48 = local_37a0._4_4_ - local_37c0[1];
    fVar49 = local_37a0._8_4_ - local_37c0[2];
    fVar38 = local_3780._4_4_ - local_37d0[1];
    fVar40 = local_3780._8_4_ - local_37d0[2];
    iVar30 = iVar30 + *(int *)(local_3480 + lVar8 + 0x1800);
    iVar31 = iVar31 + *(int *)(local_3480 + lVar8 + 0x1804);
    iVar32 = iVar32 + *(int *)(local_3480 + lVar8 + 0x1808);
    iVar33 = iVar33 + *(int *)(local_3480 + lVar8 + 0x180c);
    fVar38 = (local_3780._0_4_ - local_37d0[0]) * (fVar38 + fVar40) + fVar40 * fVar38;
    fVar40 = (local_37a0._0_4_ - local_37c0[0]) * (fVar48 + fVar49) + fVar49 * fVar48;
    uVar11 = logBlockSize & 0xffffffff;
    uVar23 = iVar30 + uVar21 >> uVar11;
    uVar27 = iVar31 + uVar21 >> uVar11;
    uVar24 = iVar32 + uVar21 >> uVar11;
    uVar26 = iVar33 + uVar21 >> uVar11;
    uVar25 = *(int *)((long)&local_3670 + lVar8) + uVar21 >> uVar11;
    uVar39 = *(int *)((long)&local_3670 + lVar8 + 4) + uVar21 >> uVar11;
    uVar41 = *(int *)((long)&local_3670 + lVar8 + 8) + uVar21 >> uVar11;
    uVar42 = *(int *)((long)&local_3670 + lVar8 + 0xc) + uVar21 >> uVar11;
    auVar18._0_4_ =
         ((float)(uVar25 & 0x7fffffff) + (float)((int)uVar25 >> 0x1f & 0x4f000000)) *
         *(float *)(local_1a70 + lVar8) +
         ((float)(uVar23 & 0x7fffffff) + (float)((int)uVar23 >> 0x1f & 0x4f000000)) *
         ((auVar34._0_4_ - afVar36[0]) * (fVar44 + fVar46) + fVar46 * fVar44 +
         (auVar22._0_4_ - afVar29[0]) * (fVar16 + fVar35) + fVar35 * fVar16) * 0.5;
    auVar18._4_4_ =
         ((float)(uVar39 & 0x7fffffff) + (float)((int)uVar39 >> 0x1f & 0x4f000000)) *
         *(float *)(local_1a70 + lVar8 + 4) +
         ((float)(uVar27 & 0x7fffffff) + (float)((int)uVar27 >> 0x1f & 0x4f000000)) *
         ((local_37b0._0_4_ - local_37f0[0]) * (fVar51 + fVar52) + fVar52 * fVar51 +
         (local_37e0._0_4_ - local_3790[0]) * (fVar45 + fVar47) + fVar47 * fVar45) * 0.5;
    auVar18._8_4_ =
         ((float)(uVar41 & 0x7fffffff) + (float)((int)uVar41 >> 0x1f & 0x4f000000)) *
         *(float *)(local_1a70 + lVar8 + 8) +
         ((float)(uVar24 & 0x7fffffff) + (float)((int)uVar24 >> 0x1f & 0x4f000000)) *
         (fVar40 + fVar38) * 0.5;
    auVar18._12_4_ =
         ((float)(uVar42 & 0x7fffffff) + (float)((int)uVar42 >> 0x1f & 0x4f000000)) *
         *(float *)(local_1a70 + lVar8 + 0xc) +
         ((float)(uVar26 & 0x7fffffff) + (float)((int)uVar26 >> 0x1f & 0x4f000000)) *
         (fVar38 + fVar40) * 0.5;
    uVar23 = -(uint)(afVar37[0] <= auVar18._0_4_);
    uVar27 = -(uint)(afVar37[1] <= auVar18._4_4_);
    uVar24 = -(uint)(afVar37[2] <= auVar18._8_4_);
    uVar26 = -(uint)(afVar37[3] <= auVar18._12_4_);
    local_3720.m128[0] = (float)((uint)local_3720.m128[0] & uVar23 | ~uVar23 & uVar7);
    local_3720.m128[1] = (float)((uint)local_3720.m128[1] & uVar27 | ~uVar27 & uVar17);
    local_3720.m128[2] = (float)((uint)local_3720.m128[2] & uVar24 | ~uVar24 & uVar19);
    local_3720.m128[3] = (float)((uint)local_3720.m128[3] & uVar26 | ~uVar26 & uVar20);
    afVar37 = (__m128)minps(auVar18,(undefined1  [16])afVar37);
    uVar7 = uVar7 + 1;
    uVar17 = uVar17 + 1;
    uVar19 = uVar19 + 1;
    uVar20 = uVar20 + 1;
    lVar8 = lVar8 + 0x10;
    pauVar14 = pauVar14 + 0xc;
  }
  local_3700.m128[0] = afVar37[0];
  local_3700.m128[1] = afVar37[1];
  local_3700.m128[2] = afVar37[2];
  local_3700.m128[3] = afVar37[3];
  fVar16 = INFINITY;
  iVar30 = 0;
  for (uVar15 = 0; uVar15 != 3; uVar15 = uVar15 + 1) {
    if ((((local_3750[uVar15] != 0.0) || (NAN(local_3750[uVar15]))) &&
        (fVar35 = *(float *)((long)&local_3700 + uVar15 * 4), fVar35 < fVar16)) &&
       (iVar31 = *(int *)((long)&local_3720 + uVar15 * 4), iVar31 != 0)) {
      uVar9 = uVar15 & 0xffffffff;
      iVar30 = iVar31;
      fVar16 = fVar35;
    }
  }
  __return_storage_ptr__->dim = (int)uVar9;
  (__return_storage_ptr__->field_2).pos = iVar30;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = local_3770._0_8_;
  *(ulong *)&(__return_storage_ptr__->mapping).ofs.field_0 = CONCAT44(fStack_375c,local_3770._16_4_)
  ;
  *(ulong *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) =
       CONCAT44(fStack_3754,fStack_3758);
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 = CONCAT44(local_3750[1],local_3750[0])
  ;
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
       CONCAT44(uStack_3744,local_3750[2]);
  __return_storage_ptr__->sah =
       fVar16 * ((set->super_PrimInfoMB).time_range.upper - (set->super_PrimInfoMB).time_range.lower
                );
  if ((int)uVar9 == -1) {
    __return_storage_ptr__->data = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

const Split find(const SetMB& set, const size_t logBlockSize, const LinearSpace3fa& space)
        {
          BinBoundsAndCenter binBoundsAndCenter(scene,set.time_range,space);
          ObjectBinner binner(empty);
          const BinMapping<BINS> mapping(set.size(),set.centBounds);
          bin_parallel(binner,set.prims->data(),set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,PARALLEL_THRESHOLD,mapping,binBoundsAndCenter);
          Split osplit = binner.best(mapping,logBlockSize);
          osplit.sah *= set.time_range.size();
          if (!osplit.valid()) osplit.data = Split::SPLIT_FALLBACK; // use fallback split
          return osplit;
        }